

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O1

void __thiscall deqp::egl::anon_unknown_1::InfiniteLoop::teardown(InfiniteLoop *this)

{
  GLenum GVar1;
  
  if (((this->super_ContextReset).m_shaderType != SHADERTYPE_COMPUTE) &&
     (this->m_coordLocation != 0)) {
    (*((this->super_ContextReset).m_gl)->disableVertexAttribArray)(this->m_coordLocation);
    GVar1 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar1,"disableVertexAttribArray(m_coordLocation)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x379);
    this->m_coordLocation = 0;
  }
  if (this->m_outputBuffer != 0) {
    (*((this->super_ContextReset).m_gl)->deleteBuffers)(1,&this->m_outputBuffer);
    GVar1 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar1,"deleteBuffers(1, &m_outputBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x380);
    this->m_outputBuffer = 0;
  }
  if (this->m_coordinatesBuffer != 0) {
    (*((this->super_ContextReset).m_gl)->deleteBuffers)(1,&this->m_coordinatesBuffer);
    GVar1 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar1,"deleteBuffers(1, &m_coordinatesBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x386);
    this->m_coordinatesBuffer = 0;
  }
  (*((this->super_ContextReset).m_gl)->useProgram)(0);
  GVar1 = (*((this->super_ContextReset).m_gl)->getError)();
  glu::checkError(GVar1,"useProgram(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x38a);
  return;
}

Assistant:

void InfiniteLoop::teardown (void)
{
	if (m_shaderType != SHADERTYPE_COMPUTE)
	{
		if (m_coordLocation)
		{
			GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(m_coordLocation));
			m_coordLocation = 0;
		}
	}

	if (m_outputBuffer)
	{
		GLU_CHECK_GLW_CALL(m_gl, deleteBuffers(1, &m_outputBuffer));
		m_outputBuffer = 0;
	}

	if (m_coordinatesBuffer)
	{
		GLU_CHECK_GLW_CALL(m_gl, deleteBuffers(1, &m_coordinatesBuffer));
		m_coordinatesBuffer = 0;
	}

	GLU_CHECK_GLW_CALL(m_gl, useProgram(0));
}